

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O1

Formula * __thiscall
Kernel::TermTransformingFormulaTransformer::applyLiteral
          (TermTransformingFormulaTransformer *this,Formula *f)

{
  Literal *lit;
  Literal *pLVar1;
  void **head;
  
  lit = *(Literal **)(f + 1);
  pLVar1 = TermTransformerCommon::transformLiteral
                     (&this->_termTransformer->super_TermTransformerCommon,lit);
  if (lit != pLVar1) {
    f = (Formula *)
        ::Lib::FixedSizeAllocator<48UL>::alloc
                  ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    f->_connective = LITERAL;
    (f->_label)._M_dataplus._M_p = (pointer)&(f->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f->_label,Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(f + 1) = pLVar1;
  }
  return f;
}

Assistant:

Formula* TermTransformingFormulaTransformer::applyLiteral(Formula* f)
{
  Literal* lit = f->literal();
  Literal* res = _termTransformer.transformLiteral(lit);
  if(lit==res) { return f; }
  return new AtomicFormula(res);
}